

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,unsigned_short *head,
          unsigned_short *tail,unsigned_short *tail_1,unsigned_short *tail_2,uchar *tail_3,
          unsigned_short *tail_4,uchar *tail_5,unsigned_short *tail_6,unsigned_short *tail_7,
          unsigned_short *tail_8,unsigned_short *tail_9)

{
  unsigned_short *in_RCX;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_RDX;
  uchar *unaff_RBX;
  uchar *in_RDI;
  unsigned_short *in_R8;
  unsigned_short *in_R9;
  unsigned_short *unaff_R14;
  unsigned_short *unaff_retaddr;
  unsigned_short *in_stack_00000008;
  unsigned_short *in_stack_00000010;
  unsigned_short *in_stack_ffffffffffffff88;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_ffffffffffffff90;
  unsigned_short *in_stack_ffffffffffffffb0;
  
  process<unsigned_short&>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            (in_RDX,in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffb0,unaff_RBX,unaff_R14,
             unaff_retaddr,in_stack_00000008,in_stack_00000010);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }